

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

Builder * __thiscall
capnp::_::OrphanBuilder::asText(Builder *__return_storage_ptr__,OrphanBuilder *this)

{
  OrphanBuilder *pOVar1;
  SegmentId id;
  uint uVar2;
  SegmentBuilder *this_00;
  ulong uVar3;
  size_t sVar4;
  word *pwVar5;
  Fault local_28;
  
  uVar2 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  if (id.value != 0 || uVar2 != 0) {
    this_00 = this->segment;
    if ((uVar2 & 3) == 2) {
      this_00 = BuilderArena::getSegment((BuilderArena *)(this_00->super_SegmentReader).arena,id);
      uVar2 = (uint)(this->tag).content;
      pwVar5 = (this_00->super_SegmentReader).ptr.ptr;
      uVar3 = (ulong)(uVar2 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar5->content + uVar3);
      this = (OrphanBuilder *)((long)&pwVar5[1].content + uVar3);
      if ((uVar2 & 4) == 0) {
        pwVar5 = &this->tag + ((int)(pOVar1->tag).content >> 2);
        this = pOVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        pwVar5 = (word *)((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                         (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      pwVar5 = this->location;
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    if (((this->tag).content & 3) == 1) {
      uVar2 = *(uint *)((long)&(this->tag).content + 4);
      if ((uVar2 & 7) == 2) {
        if (uVar2 < 8) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                    (&local_28,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x689,FAILED,(char *)0x0,
                     "\"zero-size blob can\'t be text (need NUL terminator)\"",
                     (char (*) [51])"zero-size blob can\'t be text (need NUL terminator)");
          kj::_::Debug::Fault::~Fault(&local_28);
        }
        else {
          uVar3 = (ulong)((uVar2 >> 3) - 1);
          if (*(char *)((long)&pwVar5->content + uVar3) == '\0') {
            sVar4 = uVar3 + 1;
            (__return_storage_ptr__->content).ptr = (char *)pwVar5;
            goto LAB_001c8843;
          }
          asText();
        }
      }
      else {
        asText();
      }
    }
    else {
      asText();
    }
  }
  (__return_storage_ptr__->content).ptr = &Text::Builder::nulstr;
  sVar4 = 1;
LAB_001c8843:
  (__return_storage_ptr__->content).size_ = sVar4;
  return __return_storage_ptr__;
}

Assistant:

Text::Builder OrphanBuilder::asText() {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  // Never relocates.
  return WireHelpers::getWritableTextPointer(
      tagAsPtr(), location, segment, capTable, nullptr, ZERO * BYTES);
}